

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O3

void board_printKlondikeSolverDeck(Board *board)

{
  ulong uVar1;
  Spot *pSVar2;
  uchar i;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    uVar1 = uVar5 + 1;
    iVar4 = 0;
    do {
      lVar3 = 0;
      while ((pSVar2 = board->spots[lVar3], pSVar2->type != TABLEAU ||
             (pSVar2->index != (uchar)iVar4))) {
        lVar3 = lVar3 + 1;
      }
      if (uVar5 < pSVar2->cardsCount) {
        printf("%02d%d",(ulong)pSVar2->cards[uVar5]->rank,(ulong)(pSVar2->cards[uVar5]->suit + 1));
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 7);
    uVar5 = uVar1;
  } while (uVar1 != 7);
  lVar3 = 0;
  while ((pSVar2 = board->spots[lVar3], pSVar2->type != STOCK || (pSVar2->index != '\0'))) {
    lVar3 = lVar3 + 1;
  }
  if ((ulong)pSVar2->cardsCount != 0) {
    uVar5 = (ulong)pSVar2->cardsCount + 1;
    do {
      printf("%02d%d",(ulong)pSVar2->cards[uVar5 - 2]->rank,
             (ulong)(pSVar2->cards[uVar5 - 2]->suit + 1));
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  putchar(10);
  return;
}

Assistant:

void board_printKlondikeSolverDeck(Board * board)
{
	int i,j;
	Spot * spot;

	for(i=0;i<7;i++)
	{
		for(j=0;j<7;j++)
		{
			spot = board_spotGet(board, TABLEAU, j);
			if(spot->cardsCount>=(i+1))
				printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
		}
	}

	spot = board_spotGet(board, STOCK, 0);
	for(i=spot->cardsCount-1;i>=0;i--)
	{
		printf("%02d%d", spot->cards[i]->rank, spot->cards[i]->suit+1);
	}

	printf("\n");
}